

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-process-title.c
# Opt level: O2

int run_test_process_title(void)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  undefined8 uVar4;
  int64_t eval_b;
  int64_t eval_b_1;
  char buffer [512];
  
  set_title("%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s");
  set_title("new title");
  iVar1 = uv_get_process_title(0,100);
  lVar2 = (long)iVar1;
  buffer._0_8_ = lVar2;
  if (lVar2 == -0x16) {
    iVar1 = uv_get_process_title(buffer,0);
    lVar2 = (long)iVar1;
    eval_b_1 = -0x16;
    if (lVar2 == -0x16) {
      iVar1 = uv_get_process_title(buffer,1);
      lVar2 = (long)iVar1;
      eval_b_1 = -0x69;
      if (lVar2 == -0x69) {
        return 0;
      }
      pcVar3 = "UV_ENOBUFS";
      uVar4 = 0x3a;
    }
    else {
      pcVar3 = "UV_EINVAL";
      uVar4 = 0x36;
    }
  }
  else {
    pcVar3 = "UV_EINVAL";
    uVar4 = 0x32;
    eval_b_1 = -0x16;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-process-title.c"
          ,uVar4,"r","==",pcVar3,lVar2,"==",eval_b_1);
  abort();
}

Assistant:

TEST_IMPL(process_title) {
#if defined(__sun) || defined(__CYGWIN__) || defined(__MSYS__) || \
    defined(__PASE__)
  RETURN_SKIP("uv_(get|set)_process_title is not implemented.");
#endif

  /* Check for format string vulnerabilities. */
  set_title("%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s");
  set_title("new title");

  /* Check uv_get_process_title() edge cases */
  uv_get_process_title_edge_cases();

  return 0;
}